

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::if2ip(string *__return_storage_ptr__,int address_family,string *ifn)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *pcVar6;
  allocator local_f2;
  allocator local_f1;
  string local_f0 [39];
  char local_c9;
  char local_c8 [7];
  uint8_t s6_addr_head;
  char buf_1 [46];
  in6_addr *__a;
  sockaddr_in6 *sa_1;
  allocator local_69;
  char local_68 [8];
  char buf [16];
  sockaddr_in *sa;
  ifaddrs *ifa;
  string addr_candidate;
  ifaddrs *ifap;
  string *ifn_local;
  int address_family_local;
  
  getifaddrs((undefined1 *)((long)&addr_candidate.field_2 + 8));
  std::__cxx11::string::string((string *)&ifa);
  sa = (sockaddr_in *)addr_candidate.field_2._8_8_;
  do {
    if (sa == (sockaddr_in *)0x0) {
      freeifaddrs(addr_candidate.field_2._8_8_);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ifa);
LAB_001ce01a:
      std::__cxx11::string::~string((string *)&ifa);
      return __return_storage_ptr__;
    }
    if (((*(long *)sa[1].sin_zero != 0) &&
        (bVar3 = std::operator==(ifn,*(char **)sa->sin_zero), bVar3)) &&
       ((address_family == 0 || ((uint)**(ushort **)sa[1].sin_zero == address_family)))) {
      if (**(short **)sa[1].sin_zero == 2) {
        buf._8_8_ = *(undefined8 *)sa[1].sin_zero;
        pcVar6 = inet_ntop(2,(void *)(buf._8_8_ + 4),local_68,0x10);
        if (pcVar6 != (char *)0x0) {
          freeifaddrs(addr_candidate.field_2._8_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,local_68,0x10,&local_69);
          std::allocator<char>::~allocator((allocator<char> *)&local_69);
          goto LAB_001ce01a;
        }
      }
      else if (**(short **)sa[1].sin_zero == 10) {
        lVar2 = *(long *)sa[1].sin_zero;
        uVar1 = *(uint *)(lVar2 + 8);
        uVar4 = htonl(0xffc00000);
        uVar5 = htonl(0xfe800000);
        if ((uVar1 & uVar4) != uVar5) {
          memset(local_c8,0,0x2e);
          pcVar6 = inet_ntop(10,(void *)(lVar2 + 8),local_c8,0x2e);
          if (pcVar6 != (char *)0x0) {
            local_c9 = *(char *)(lVar2 + 8);
            if ((local_c9 != -4) && (local_c9 != -3)) {
              freeifaddrs(addr_candidate.field_2._8_8_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)__return_storage_ptr__,local_c8,0x2e,&local_f2)
              ;
              std::allocator<char>::~allocator((allocator<char> *)&local_f2);
              goto LAB_001ce01a;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f0,local_c8,0x2e,&local_f1);
            std::__cxx11::string::operator=((string *)&ifa,local_f0);
            std::__cxx11::string::~string(local_f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          }
        }
      }
    }
    sa = *(sockaddr_in **)sa;
  } while( true );
}

Assistant:

inline std::string if2ip(int address_family, const std::string &ifn) {
  struct ifaddrs *ifap;
  getifaddrs(&ifap);
  std::string addr_candidate;
  for (auto ifa = ifap; ifa; ifa = ifa->ifa_next) {
    if (ifa->ifa_addr && ifn == ifa->ifa_name &&
        (AF_UNSPEC == address_family ||
         ifa->ifa_addr->sa_family == address_family)) {
      if (ifa->ifa_addr->sa_family == AF_INET) {
        auto sa = reinterpret_cast<struct sockaddr_in *>(ifa->ifa_addr);
        char buf[INET_ADDRSTRLEN];
        if (inet_ntop(AF_INET, &sa->sin_addr, buf, INET_ADDRSTRLEN)) {
          freeifaddrs(ifap);
          return std::string(buf, INET_ADDRSTRLEN);
        }
      } else if (ifa->ifa_addr->sa_family == AF_INET6) {
        auto sa = reinterpret_cast<struct sockaddr_in6 *>(ifa->ifa_addr);
        if (!IN6_IS_ADDR_LINKLOCAL(&sa->sin6_addr)) {
          char buf[INET6_ADDRSTRLEN] = {};
          if (inet_ntop(AF_INET6, &sa->sin6_addr, buf, INET6_ADDRSTRLEN)) {
            // equivalent to mac's IN6_IS_ADDR_UNIQUE_LOCAL
            auto s6_addr_head = sa->sin6_addr.s6_addr[0];
            if (s6_addr_head == 0xfc || s6_addr_head == 0xfd) {
              addr_candidate = std::string(buf, INET6_ADDRSTRLEN);
            } else {
              freeifaddrs(ifap);
              return std::string(buf, INET6_ADDRSTRLEN);
            }
          }
        }
      }
    }
  }
  freeifaddrs(ifap);
  return addr_candidate;
}